

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O2

void __thiscall MutableS2ShapeIndex::Iterator::Begin(Iterator *this)

{
  const_iterator cVar1;
  S2LogMessage SStack_18;
  
  if ((this->index_->index_status_)._M_i == FRESH) {
    cVar1 = gtl::internal_btree::
            btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
            ::begin((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                     *)&this->index_->cell_map_);
    (this->iter_).node = cVar1.node;
    (this->iter_).position = cVar1.position;
    Refresh(this);
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.h"
             ,0x216,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: index_->is_fresh() ");
  abort();
}

Assistant:

inline void MutableS2ShapeIndex::Iterator::Begin() {
  // Make sure that the index has not been modified since Init() was called.
  S2_DCHECK(index_->is_fresh());
  iter_ = index_->cell_map_.begin();
  Refresh();
}